

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  char *pcVar1;
  ostream *poVar2;
  undefined3 in_register_00000011;
  
  poVar2 = std::operator<<(this->m_os,' ');
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,"=\"");
  pcVar1 = "mpmc.empty() == false";
  if (CONCAT31(in_register_00000011,attribute) != 0) {
    pcVar1 = "mpmc.empty() == true";
  }
  poVar2 = std::operator<<(poVar2,pcVar1 + 0x10);
  std::operator<<(poVar2,'\"');
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, bool attribute ) {
        m_os << ' ' << name << "=\"" << ( attribute ? "true" : "false" ) << '"';
        return *this;
    }